

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walHashGet(Wal *pWal,int iHash,WalHashLoc *pLoc)

{
  int iVar1;
  int rc;
  WalHashLoc *pLoc_local;
  int iHash_local;
  Wal *pWal_local;
  
  iVar1 = walIndexPage(pWal,iHash,&pLoc->aPgno);
  if (iVar1 == 0) {
    pLoc->aHash = (ht_slot *)(pLoc->aPgno + 0x1000);
    if (iHash == 0) {
      pLoc->aPgno = pLoc->aPgno + 0x22;
      pLoc->iZero = 0;
    }
    else {
      pLoc->iZero = (iHash + -1) * 0x1000 + 0xfde;
    }
    pLoc->aPgno = pLoc->aPgno + -1;
  }
  return iVar1;
}

Assistant:

static int walHashGet(
  Wal *pWal,                      /* WAL handle */
  int iHash,                      /* Find the iHash'th table */
  WalHashLoc *pLoc                /* OUT: Hash table location */
){
  int rc;                         /* Return code */

  rc = walIndexPage(pWal, iHash, &pLoc->aPgno);
  assert( rc==SQLITE_OK || iHash>0 );

  if( rc==SQLITE_OK ){
    pLoc->aHash = (volatile ht_slot *)&pLoc->aPgno[HASHTABLE_NPAGE];
    if( iHash==0 ){
      pLoc->aPgno = &pLoc->aPgno[WALINDEX_HDR_SIZE/sizeof(u32)];
      pLoc->iZero = 0;
    }else{
      pLoc->iZero = HASHTABLE_NPAGE_ONE + (iHash-1)*HASHTABLE_NPAGE;
    }
    pLoc->aPgno = &pLoc->aPgno[-1];
  }
  return rc;
}